

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaBucketPtr_conflict
xmlSchemaGetSchemaBucket(xmlSchemaParserCtxtPtr pctxt,xmlChar *schemaLocation)

{
  xmlSchemaItemListPtr pxVar1;
  int local_34;
  int i;
  xmlSchemaItemListPtr list;
  xmlSchemaBucketPtr_conflict cur;
  xmlChar *schemaLocation_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  pxVar1 = pctxt->constructor->buckets;
  if (pxVar1->nbItems != 0) {
    for (local_34 = 0; local_34 < pxVar1->nbItems; local_34 = local_34 + 1) {
      if (((xmlSchemaBucketPtr_conflict)pxVar1->items[local_34])->schemaLocation == schemaLocation)
      {
        return (xmlSchemaBucketPtr_conflict)pxVar1->items[local_34];
      }
    }
  }
  return (xmlSchemaBucketPtr_conflict)0x0;
}

Assistant:

static xmlSchemaBucketPtr
xmlSchemaGetSchemaBucket(xmlSchemaParserCtxtPtr pctxt,
			    const xmlChar *schemaLocation)
{
    xmlSchemaBucketPtr cur;
    xmlSchemaItemListPtr list;

    list = pctxt->constructor->buckets;
    if (list->nbItems == 0)
	return(NULL);
    else {
	int i;
	for (i = 0; i < list->nbItems; i++) {
	    cur = (xmlSchemaBucketPtr) list->items[i];
	    /* Pointer comparison! */
	    if (cur->schemaLocation == schemaLocation)
		return(cur);
	}
    }
    return(NULL);
}